

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

MapType * __thiscall helics::HandleManager::getMap(HandleManager *this,InterfaceType type)

{
  InterfaceType type_local;
  HandleManager *this_local;
  MapType *local_8;
  
  switch(type) {
  case ENDPOINT:
  case SINK:
  case TRANSLATOR:
  default:
    local_8 = &this->endpoints;
    break;
  case FILTER:
    local_8 = &this->filters;
    break;
  case INPUT:
    local_8 = &this->inputs;
    break;
  case PUBLICATION:
    local_8 = &this->publications;
  }
  return local_8;
}

Assistant:

const HandleManager::MapType& HandleManager::getMap(InterfaceType type) const
{
    {
        switch (type) {
            case InterfaceType::ENDPOINT:
            case InterfaceType::TRANSLATOR:
            case InterfaceType::SINK:
            default:
                return endpoints;
            case InterfaceType::PUBLICATION:
                return publications;
            case InterfaceType::INPUT:
                return inputs;
            case InterfaceType::FILTER:
                return filters;
        }
    }
}